

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O2

string * jbcoin::trim_whitespace(string *__return_storage_ptr__,string *str)

{
  locale local_20 [8];
  
  std::locale::locale(local_20);
  boost::algorithm::trim<std::__cxx11::string>(str,local_20);
  std::locale::~locale(local_20);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::string trim_whitespace (std::string str)
{
    boost::trim (str);
    return str;
}